

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcDebugGetStackFrameCount(void)

{
  uint uVar1;
  undefined4 local_10;
  undefined4 local_c;
  uint currentFrame;
  uint callStackSize;
  
  local_c = 0;
  local_10 = 0;
  while( true ) {
    uVar1 = nullcDebugEnumStackFrame(local_10);
    if (uVar1 == 0) break;
    local_c = local_c + 1;
    local_10 = local_10 + 1;
  }
  return local_c;
}

Assistant:

unsigned int nullcDebugGetStackFrameCount()
{
	using namespace NULLC;

	unsigned callStackSize = 0;

	unsigned currentFrame = 0;
	while(nullcDebugEnumStackFrame(currentFrame++))
		callStackSize++;

	return callStackSize;
}